

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O1

int main(void)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  uchar test_case [5];
  undefined8 local_38;
  undefined5 uStack_30;
  undefined3 uStack_2b;
  undefined5 uStack_28;
  
  uVar1 = (ulong)local_38 >> 0x20;
  local_38 = CONCAT44((uint)uVar1 & 0xffffff00,0xfd0101);
  sVar2 = strlen((char *)&local_38);
  printf("\nRequest : ");
  iVar3 = (int)sVar2;
  print_buffer((uchar *)&local_38,iVar3);
  test_openssl_1_0_1f((uchar *)&local_38,iVar3);
  test_openssl_1_0_1g((uchar *)&local_38,iVar3);
  local_38 = 0xdeefbeaddefd0101;
  uStack_30 = 0xaddeefbead;
  uStack_2b = 0xdeefbe;
  uStack_28 = 0xefbead;
  sVar2 = strlen((char *)&local_38);
  printf("\nRequest : ");
  iVar3 = (int)sVar2;
  print_buffer((uchar *)&local_38,iVar3);
  test_openssl_1_0_1f((uchar *)&local_38,iVar3);
  test_openssl_1_0_1g((uchar *)&local_38,iVar3);
  return 0;
}

Assistant:

int main() {

  // 0x01fd -> 509

  {
    unsigned char test_case[] = "\x01\x01\xfd\x00";
    int len = (int) strlen(test_case);

    printf("\nRequest : ");
    print_buffer(test_case, len);

    test_openssl_1_0_1f(test_case, len);
    test_openssl_1_0_1g(test_case, len);
  }

  {
    unsigned char test_case[] = "\x01\x01\xfd\xde\xad\xbe\xef\xde\xad\xbe\xef\xde\xad\xbe\xef\xde\xad\xbe\xef\x00";
    int len = (int) strlen(test_case);

    printf("\nRequest : ");
    print_buffer(test_case, len);

    test_openssl_1_0_1f(test_case, len);
    test_openssl_1_0_1g(test_case, len);
  }
}